

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void Memory::HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::GenerateValidPointersMap
               (ValidPointersMapTable *validTable,InvalidBitsTable *invalidTable,
               BlockInfoMapTable *blockInfoTable)

{
  long lVar1;
  BlockInfoMapRow *paBVar2;
  short *psVar3;
  ushort uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ValidPointersMapTable *paauVar17;
  ushort uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ushort uVar26;
  uint uVar27;
  BVIndex i;
  ulong uVar28;
  ushort *puVar29;
  undefined1 auVar30 [16];
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM4 [16];
  undefined1 in_XMM5 [16];
  undefined1 in_XMM6 [16];
  undefined1 in_XMM7 [16];
  long local_58;
  long local_48;
  ulong local_38;
  
  if (validTable != (ValidPointersMapTable *)0x0) {
    memset(validTable,0xff,0x3a000);
  }
  local_38 = 0x40;
  local_48 = 0x80;
  local_58 = 0x400;
  lVar25 = -0x40;
  lVar13 = 0;
  do {
    puVar29 = (*validTable)[0] + 0x800;
    if (validTable == (ValidPointersMapTable *)0x0) {
      puVar29 = (ushort *)0x0;
    }
    memset(*invalidTable + lVar13,0xff,0x100);
    lVar1 = lVar13 + 1;
    uVar15 = lVar1 * 0x100 + 0x300;
    uVar5 = 0x8000 / (ushort)uVar15;
    paBVar2 = *blockInfoTable + lVar13;
    ((BlockInfo *)((long)paBVar2 + 0))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar2 + 0))->pageObjectCount = 0;
    ((BlockInfo *)((long)paBVar2 + 4))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar2 + 4))->pageObjectCount = 0;
    ((BlockInfo *)((long)paBVar2 + 8))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar2 + 8))->pageObjectCount = 0;
    ((BlockInfo *)((long)paBVar2 + 0xc))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar2 + 0xc))->pageObjectCount = 0;
    paBVar2 = *blockInfoTable + lVar13;
    ((BlockInfo *)((long)paBVar2 + 0x10))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar2 + 0x10))->pageObjectCount = 0;
    ((BlockInfo *)((long)paBVar2 + 0x14))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar2 + 0x14))->pageObjectCount = 0;
    ((BlockInfo *)((long)paBVar2 + 0x18))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar2 + 0x18))->pageObjectCount = 0;
    ((BlockInfo *)((long)paBVar2 + 0x1c))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar2 + 0x1c))->pageObjectCount = 0;
    i = 0;
    uVar28 = 0;
    uVar27 = 0;
    paauVar17 = validTable;
    do {
      uVar26 = (ushort)uVar27;
      if (validTable != (ValidPointersMapTable *)0x0) {
        (*paauVar17)[0][0] = uVar26;
      }
      uVar14 = (ulong)((uint)(uVar28 >> 10) & 0x3fffc);
      psVar3 = (short *)((long)&(*blockInfoTable)[lVar13][0].pageObjectCount + uVar14);
      *psVar3 = *psVar3 + 1;
      uVar4 = *(ushort *)((long)&(*blockInfoTable)[lVar13][0].lastObjectIndexOnPage + uVar14);
      if (uVar26 <= uVar4) {
        uVar26 = uVar4;
      }
      *(ushort *)((long)&(*blockInfoTable)[lVar13][0].lastObjectIndexOnPage + uVar14) = uVar26;
      BVStatic<2048UL>::Clear(*invalidTable + lVar13,i);
      auVar12 = _DAT_00fa8550;
      uVar27 = uVar27 + 1;
      paauVar17 = (ValidPointersMapTable *)((long)(*paauVar17)[0] + local_48);
      uVar28 = uVar28 + local_58;
      i = i + (int)local_38;
    } while (uVar27 < uVar5);
    in_XMM4 = pmovsxbq(in_XMM4,0x706);
    in_XMM5 = pmovsxbq(in_XMM5,0x504);
    in_XMM6 = pmovsxbq(in_XMM6,0x302);
    if (puVar29 == (ushort *)0x0) {
      validTable = (ValidPointersMapTable *)0x0;
    }
    else {
      validTable = (ValidPointersMapTable *)(puVar29 + 0x800);
      puVar29 = puVar29 + 7;
      uVar14 = 1;
      lVar16 = 7;
      lVar19 = 0;
      uVar20 = 0;
      in_XMM7 = pmovsxbq(in_XMM7,0x100);
      uVar28 = local_38;
      do {
        uVar21 = 0x800;
        if (uVar28 < 0x800) {
          uVar21 = uVar28;
        }
        if (uVar21 <= uVar14) {
          uVar21 = uVar14;
        }
        if ((uint)((int)lVar19 * (int)(uVar15 >> 4)) < 0x800) {
          uVar22 = local_38 + uVar20;
          if (0x7ff < uVar22) {
            uVar22 = 0x800;
          }
          uVar24 = uVar20 | 1;
          if ((uVar20 | 1) < uVar22) {
            uVar24 = uVar22;
          }
          lVar23 = (lVar13 * -0x10 + -0x40) * lVar19 + uVar24 + -1;
          auVar30._8_4_ = (int)lVar23;
          auVar30._0_8_ = lVar23;
          auVar30._12_4_ = (int)((ulong)lVar23 >> 0x20);
          uVar22 = 0;
          do {
            auVar32._8_4_ = (int)uVar22;
            auVar32._0_8_ = uVar22;
            auVar32._12_4_ = (int)(uVar22 >> 0x20);
            auVar34 = (auVar32 | in_XMM7) ^ auVar12;
            lVar23 = SUB168(auVar30 ^ auVar12,0);
            auVar35._0_8_ = -(ulong)(lVar23 < auVar34._0_8_);
            lVar31 = SUB168(auVar30 ^ auVar12,8);
            auVar35._8_8_ = -(ulong)(lVar31 < auVar34._8_8_);
            auVar38 = pshuflw(in_XMM3,auVar35,0xe8);
            auVar34._8_4_ = 0xffffffff;
            auVar34._0_8_ = 0xffffffffffffffff;
            auVar34._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar38 ^ auVar34,auVar38 ^ auVar34);
            uVar18 = (ushort)lVar19;
            if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar29[uVar22 - 7] = uVar18;
            }
            auVar35 = packssdw(auVar35,auVar35);
            auVar38._8_4_ = 0xffffffff;
            auVar38._0_8_ = 0xffffffffffffffff;
            auVar38._12_4_ = 0xffffffff;
            auVar35 = packssdw(auVar35 ^ auVar38,auVar35 ^ auVar38);
            if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar29[uVar22 - 6] = uVar18;
            }
            auVar35 = (auVar32 | in_XMM6) ^ auVar12;
            auVar36._0_8_ = -(ulong)(lVar23 < auVar35._0_8_);
            auVar36._8_8_ = -(ulong)(lVar31 < auVar35._8_8_);
            auVar34 = packssdw(auVar34,auVar36);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar34 ^ auVar6,auVar34 ^ auVar6);
            if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar29[uVar22 - 5] = uVar18;
            }
            auVar35 = pshufhw(auVar36,auVar36,0x84);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            auVar35 = packssdw(auVar35 ^ auVar7,auVar35 ^ auVar7);
            if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar29[uVar22 - 4] = uVar18;
            }
            auVar35 = (auVar32 | in_XMM5) ^ auVar12;
            auVar37._0_8_ = -(ulong)(lVar23 < auVar35._0_8_);
            auVar37._8_8_ = -(ulong)(lVar31 < auVar35._8_8_);
            auVar34 = pshuflw(auVar34,auVar37,0xe8);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            in_XMM3 = packssdw(auVar34 ^ auVar8,auVar34 ^ auVar8);
            if ((in_XMM3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar29[uVar22 - 3] = uVar18;
            }
            auVar34 = packssdw(auVar37,auVar37);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar34 ^ auVar9,auVar34 ^ auVar9);
            if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar29[uVar22 - 2] = uVar18;
            }
            auVar32 = (auVar32 | in_XMM4) ^ auVar12;
            auVar33._0_8_ = -(ulong)(lVar23 < auVar32._0_8_);
            auVar33._8_8_ = -(ulong)(lVar31 < auVar32._8_8_);
            auVar34 = packssdw(auVar34,auVar33);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar34 ^ auVar10,auVar34 ^ auVar10);
            if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar29[uVar22 - 1] = uVar18;
            }
            auVar34 = pshufhw(auVar33,auVar33,0x84);
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar34 ^ auVar11,auVar34 ^ auVar11);
            if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar29[uVar22] = uVar18;
            }
            uVar22 = uVar22 + 8;
          } while ((uVar21 + lVar16 & 0xfffffffffffffff8) != uVar22);
        }
        lVar19 = lVar19 + 1;
        uVar20 = uVar20 + local_38;
        uVar28 = uVar28 + local_38;
        uVar14 = uVar14 + local_38;
        lVar16 = lVar16 + lVar25;
        puVar29 = (ushort *)((long)puVar29 + local_48);
      } while ((uint)lVar19 < uVar5);
    }
    local_38 = local_38 + 0x10;
    local_48 = local_48 + 0x20;
    local_58 = local_58 + 0x100;
    lVar25 = lVar25 + -0x10;
    lVar13 = lVar1;
  } while (lVar1 != 0x1d);
  return;
}

Assistant:

void HeapInfo::ValidPointersMap<TBlockAttributes>::GenerateValidPointersMap(ValidPointersMapTable * validTable, InvalidBitsTable& invalidTable, BlockInfoMapTable& blockInfoTable)
{
    // Create the valid pointer map to be shared by the buckets.
    // Also create the invalid objects bit vector.
    ushort * buffer = &((*validTable)[0][0]);
    if (buffer)
    {
        memset(buffer, -1, sizeof(ushort) * 2 * TBlockAttributes::MaxSmallObjectCount * TBlockAttributes::BucketCount);
    }

    for (uint i = 0; i < TBlockAttributes::BucketCount; i++)
    {
        // Non-interior first
        ushort * validPointers = buffer;
        if (buffer)
        {            
            buffer += TBlockAttributes::MaxSmallObjectCount;
        }

        typename SmallHeapBlockT<TBlockAttributes>::SmallHeapBlockBitVector * invalidBitVector = &invalidTable[i];
        invalidBitVector->SetAll();

        uint bucketSize;

        if (TBlockAttributes::IsSmallBlock)
        {
            bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::ObjectGranularity * i;
        }
        else
        {
            bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::MediumObjectGranularity * (i + 1);
        }

        uint stride = bucketSize / HeapConstants::ObjectGranularity;
        uint maxObjectCountForBucket = ((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucketSize);

        BlockInfoMapRow* blockInfoRow = &blockInfoTable[i];

        memset(blockInfoRow, 0, sizeof(BlockInfoMapRow));

        for (ushort j = 0; j < maxObjectCountForBucket; j++)
        {
            if (validPointers)
            {
                validPointers[j * stride] = j;
            }

            uintptr_t objectAddress = j * bucketSize;
            Assert(objectAddress / AutoSystemInfo::PageSize < USHRT_MAX);
            ushort pageIndex = (ushort)(objectAddress / AutoSystemInfo::PageSize);

            (*blockInfoRow)[pageIndex].pageObjectCount++;
            (*blockInfoRow)[pageIndex].lastObjectIndexOnPage = max(j, (*blockInfoRow)[pageIndex].lastObjectIndexOnPage);

            invalidBitVector->Clear(j * stride);
        }

        if (buffer)
        {
            // interior pointer
            ushort * validInteriorPointers = buffer;
            buffer += TBlockAttributes::MaxSmallObjectCount;
            for (ushort j = 0; j < maxObjectCountForBucket; j++)
            {
                uint start = j * stride;
                uint end = min(start + stride, TBlockAttributes::MaxSmallObjectCount);
                for (uint k = start; k < end; k++)
                {
                    validInteriorPointers[k] = j;
                }
            }
        }
    }
}